

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getInfo.cpp
# Opt level: O2

int __thiscall ssllabs::SSLlabs::getInfo(SSLlabs *this,labsInfo_t *info)

{
  bool bVar1;
  int iVar2;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *pGVar3;
  Type pGVar4;
  int64_t iVar5;
  ValueIterator this_00;
  ValueIterator pGVar6;
  Ch *pCVar7;
  allocator local_d1;
  Data local_d0 [2];
  Document document;
  string data;
  
  data._M_dataplus._M_p = (pointer)&data.field_2;
  data._M_string_length = 0;
  data.field_2._M_local_buf[0] = '\0';
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&document,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  std::__cxx11::string::string((string *)&local_d0[0].s,"/info",&local_d1);
  curl_read(this,(string *)&local_d0[0].s,&data);
  std::__cxx11::string::~string((string *)&local_d0[0].s);
  pGVar3 = rapidjson::
           GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
           ::Parse<0u,rapidjson::UTF8<char>>
                     ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                       *)&document,data._M_dataplus._M_p);
  if ((pGVar3->parseResult_).code_ == kParseErrorNone) {
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(&document.
                         super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ,"engineVersion");
    if (bVar1) {
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)&document,"engineVersion");
      if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x400000000000000)
          != (undefined1  [16])0x0) {
        pGVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&document,"engineVersion");
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString(pGVar4);
        std::__cxx11::string::assign((char *)info);
      }
    }
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(&document.
                         super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ,"criteriaVersion");
    if (bVar1) {
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)&document,"criteriaVersion");
      if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x400000000000000)
          != (undefined1  [16])0x0) {
        pGVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&document,"criteriaVersion");
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString(pGVar4);
        std::__cxx11::string::assign((char *)&info->CriteriaVersion);
      }
    }
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(&document.
                         super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ,"clientMaxAssessments");
    if (bVar1) {
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)&document,"clientMaxAssessments");
      if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x20000000000000)
          != (undefined1  [16])0x0) {
        pGVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&document,"clientMaxAssessments");
        iVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetInt(pGVar4);
        info->MaxAssessments = iVar2;
      }
    }
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(&document.
                         super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ,"currentAssessments");
    if (bVar1) {
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)&document,"currentAssessments");
      if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x20000000000000)
          != (undefined1  [16])0x0) {
        pGVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&document,"currentAssessments");
        iVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetInt(pGVar4);
        info->CurrentAssessments = iVar2;
      }
    }
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(&document.
                         super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ,"newAssessmentCoolOff");
    if (bVar1) {
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)&document,"newAssessmentCoolOff");
      if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x80000000000000)
          != (undefined1  [16])0x0) {
        pGVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&document,"newAssessmentCoolOff");
        iVar5 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetInt64(pGVar4);
        info->NewAssessmentCoolOff = iVar5;
      }
    }
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(&document.
                         super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ,"messages");
    iVar2 = 0;
    if (bVar1) {
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)&document,"messages");
      iVar2 = 0;
      if ((pGVar4->data_).f.flags == 4) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
        ::operator[]<char_const>
                  ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    *)&document,"messages");
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetArray((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_d0[0].s);
        this_00 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::Begin((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_d0[0]._0_8_);
        while( true ) {
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          ::operator[]<char_const>
                    ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      *)&document,"messages");
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetArray((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_d0[0].s);
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::End((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)local_d0[0]._0_8_);
          if (this_00 == pGVar6) break;
          if ((undefined1  [16])
              ((undefined1  [16])this_00->data_ & (undefined1  [16])0x400000000000000) !=
              (undefined1  [16])0x0) {
            pCVar7 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::GetString(this_00);
            std::__cxx11::string::string((string *)&local_d0[0].s,pCVar7,&local_d1);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &info->Messages,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_d0[0].s);
            std::__cxx11::string::~string((string *)&local_d0[0].s);
          }
          this_00 = this_00 + 1;
        }
      }
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,"could not parse json document\n");
    iVar2 = -1;
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&document);
  std::__cxx11::string::~string((string *)&data);
  return iVar2;
}

Assistant:

int SSLlabs::getInfo(labsInfo_t &info) {
        std::string data = {};
        rapidjson::Document document;

        curl_read("/info", data);
        if (document.Parse<0>(data.c_str()).HasParseError()) {
            std::cerr << "could not parse json document\n";
            return -1;
        }

        if (document.HasMember("engineVersion") && document["engineVersion"].IsString()) {
            info.EngineVersion.assign(document["engineVersion"].GetString());
        }

        if (document.HasMember("criteriaVersion") && document["criteriaVersion"].IsString()) {
            info.CriteriaVersion.assign(document["criteriaVersion"].GetString());
        }

        if (document.HasMember("clientMaxAssessments") && document["clientMaxAssessments"].IsInt()) {
            info.MaxAssessments = document["clientMaxAssessments"].GetInt();
        }

        if (document.HasMember("currentAssessments") && document["currentAssessments"].IsInt()) {
            info.CurrentAssessments = document["currentAssessments"].GetInt();
        }

        if (document.HasMember("newAssessmentCoolOff") && document["newAssessmentCoolOff"].IsInt64()) {
            info.NewAssessmentCoolOff = document["newAssessmentCoolOff"].GetInt64();
        }

        if (document.HasMember("messages") && document["messages"].IsArray()) {
            for (auto i = document["messages"].GetArray().Begin(); i != document["messages"].GetArray().End(); i++) {
                if (i->IsString()) {
                    info.Messages.push_back(i->GetString());
                }
            }
        }

        return 0;
    }